

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

HRESULT __thiscall
Js::ScriptContext::CompileUTF8Core
          (ScriptContext *this,Parser *ps,Utf8SourceInfo *utf8SourceInfo,SRCINFO *srcInfo,
          BOOL fOriginalUTF8Code,LPCUTF8 pszSrc,size_t cbLength,ULONG grfscr,
          CompileScriptException *pse,charcount_t *cchLength,size_t *srcLength,uint *sourceIndex,
          ParseableFunctionInfo **func,SimpleDataCacheWrapper *pDataCache)

{
  byte bVar1;
  Type TVar2;
  code *pcVar3;
  ParseNodeProg *this_00;
  bool bVar4;
  bool bVar5;
  HRESULT HVar6;
  uint sourceIndex_00;
  undefined4 *puVar7;
  char *cbLength_00;
  LPCUTF8 extraout_RDX;
  LPCUTF8 extraout_RDX_00;
  LPCUTF8 extraout_RDX_01;
  LPCUTF8 extraout_RDX_02;
  LPCUTF8 pszSrc_00;
  ULONG sourceCRC;
  ScriptContext **ppSVar8;
  char *pcVar9;
  SRCINFO *srcInfo_00;
  Utf8SourceInfo *this_01;
  Parser *nextFunctionId;
  DWORD parserStateCacheByteCount;
  SourceContextInfo *sourceContextInfo;
  ScriptContext *local_50;
  ParseNodeProg *parseTree;
  Utf8SourceInfo *local_40;
  Parser *local_38;
  
  local_38 = (Parser *)CONCAT44(local_38._4_4_,fOriginalUTF8Code);
  bVar4 = false;
  *func = (ParseableFunctionInfo *)0x0;
  *srcLength = (ulong)*cchLength;
  local_50 = (ScriptContext *)0x0;
  sourceContextInfo = (srcInfo->sourceContextInfo).ptr;
  parseTree = (ParseNodeProg *)this;
  local_40 = utf8SourceInfo;
  if ((((grfscr >> 8 & 1) != 0) && (bVar4 = false, pDataCache != (SimpleDataCacheWrapper *)0x0)) &&
     (DAT_015ad2e9 != '\0')) {
    bVar4 = IsScriptContextInDebugMode(this);
    bVar4 = !bVar4;
  }
  if (bVar4) {
    CalculateCRC(0,cbLength,pszSrc);
    if (pDataCache == (SimpleDataCacheWrapper *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x859,"(pDataCache != nullptr)","pDataCache != nullptr");
      if (!bVar5) goto LAB_0079613a;
      *puVar7 = 0;
    }
    *func = (ParseableFunctionInfo *)0x0;
  }
  nextFunctionId = (Parser *)&sourceContextInfo->nextLocalFunctionId;
  pcVar9 = (char *)ps;
  if ((int)local_38 == 0) {
    ppSVar8 = &local_50;
    srcInfo_00 = (SRCINFO *)(ulong)grfscr;
    HVar6 = Parser::ParseCesu8Source
                      (ps,(ParseNodeProg **)ppSVar8,pszSrc,cbLength,grfscr,pse,
                       (LocalFunctionId *)nextFunctionId,sourceContextInfo);
    parserStateCacheByteCount = (DWORD)sourceContextInfo;
    sourceCRC = (ULONG)ppSVar8;
    pszSrc_00 = extraout_RDX_00;
  }
  else {
    ppSVar8 = &local_50;
    srcInfo_00 = (SRCINFO *)(ulong)grfscr;
    HVar6 = Parser::ParseUtf8Source
                      (ps,(ParseNodeProg **)ppSVar8,pszSrc,cbLength,grfscr,pse,
                       (LocalFunctionId *)nextFunctionId,sourceContextInfo);
    parserStateCacheByteCount = (DWORD)sourceContextInfo;
    sourceCRC = (ULONG)ppSVar8;
    TVar2 = ps->m_sourceLim;
    *cchLength = TVar2;
    local_40->m_cchLength = TVar2;
    pszSrc_00 = extraout_RDX;
  }
  this_00 = parseTree;
  local_40->parseFlags = grfscr;
  *srcLength = ps->m_length;
  cbLength_00 = (char *)srcLength;
  this_01 = local_40;
  if (-1 < HVar6) {
    bVar5 = (int)local_38 == 0;
    local_38 = ps;
    sourceIndex_00 = SaveSourceNoCopy((ScriptContext *)parseTree,local_40,(int)pszSrc_00,bVar5);
    pcVar9 = (char *)local_50;
    *sourceIndex = sourceIndex_00;
    bVar5 = IsScriptContextInSourceRundownOrDebugMode((ScriptContext *)this_00);
    this_01 = local_40;
    srcInfo_00 = (SRCINFO *)(ulong)sourceIndex_00;
    cbLength_00 = (char *)func;
    sourceCRC = grfscr;
    nextFunctionId = local_38;
    HVar6 = GenerateByteCode((ParseNodeProg *)pcVar9,grfscr,(ScriptContext *)this_00,func,
                             sourceIndex_00,
                             (bool)(bVar5 & (char)this_00[0x13].super_ParseNodeFnc.fncFlags),
                             local_38,pse,(ScopeInfo *)0x0,(ScriptFunction **)0x0);
    parserStateCacheByteCount = (DWORD)pse;
    this_01->byteCodeGenerationFlags = grfscr;
    pszSrc_00 = extraout_RDX_01;
  }
  if (HVar6 < 0) {
    bVar4 = IsScriptContextInDebugMode((ScriptContext *)parseTree);
    if (((bVar4) && (bVar1 = this_01->field_0xa8, (bVar1 & 4) == 0)) &&
       (((bVar1 & 0x40) == 0 ||
        ((bVar1 & 0x20) == 0 && (this_01->debugModeSource).ptr == (uchar *)0x0)))) {
      Utf8SourceInfo::SetInDebugMode(this_01,true);
    }
  }
  else if (bVar4) {
    if (*func == (ParseableFunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      pcVar9 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
      ;
      cbLength_00 = "*func != nullptr";
      sourceCRC = 0x9b1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x9b1,"(*func != nullptr)","*func != nullptr");
      if (!bVar4) {
LAB_0079613a:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
      pszSrc_00 = extraout_RDX_02;
    }
    TrySerializeParserState
              ((ScriptContext *)pcVar9,sourceCRC,pszSrc_00,(size_t)cbLength_00,srcInfo_00,*func,
               (byte *)nextFunctionId,parserStateCacheByteCount,pDataCache);
  }
  return HVar6;
}

Assistant:

HRESULT ScriptContext::CompileUTF8Core(
        __in Parser& ps,
        __in Js::Utf8SourceInfo* utf8SourceInfo,
        __in SRCINFO *srcInfo,
        __in BOOL fOriginalUTF8Code,
        _In_reads_bytes_(cbLength) LPCUTF8 pszSrc,
        __in size_t cbLength,
        __in ULONG grfscr,
        __in CompileScriptException *pse,
        __inout charcount_t& cchLength,
        __out size_t& srcLength,
        __out uint& sourceIndex,
        __deref_out Js::ParseableFunctionInfo ** func,
        __in_opt Js::SimpleDataCacheWrapper* pDataCache
    )
    {
        HRESULT hr = E_FAIL;
        (*func) = nullptr;
        srcLength = cchLength;

        bool isCesu8 = !fOriginalUTF8Code;
        ParseNodeProg * parseTree = nullptr;
        SourceContextInfo * sourceContextInfo = srcInfo->sourceContextInfo;
        bool fUseParserStateCache = ((grfscr & fscrCreateParserState) == fscrCreateParserState)
            && CONFIG_FLAG(ParserStateCache)
            && pDataCache != nullptr
            && !this->IsScriptContextInDebugMode();
        byte* parserStateCacheBuffer = nullptr;
        DWORD parserStateCacheByteCount = 0;
        uint computedSourceCRC = 0;

        if (fUseParserStateCache)
        {
            computedSourceCRC = CalculateCRC(0, cbLength, (void*)pszSrc);
            hr = TryDeserializeParserState(grfscr, computedSourceCRC, cchLength, srcInfo, utf8SourceInfo, sourceIndex, isCesu8, nullptr, func, &parserStateCacheBuffer, &parserStateCacheByteCount, pDataCache);
#ifdef ENABLE_WININET_PROFILE_DATA_CACHE
            // ERROR_WRITE_PROTECT indicates we cannot cache this script for whatever reason.
            // Disable generating and serializing the parser state cache.
            if (hr == HRESULT_FROM_WIN32(ERROR_WRITE_PROTECT))
            {
                fUseParserStateCache = false;
                grfscr &= ~fscrCreateParserState;
            }
#endif
        }

        // If hydrating the parser state cache failed, let's try to do an ordinary parse
        if (FAILED(hr) || *func == nullptr)
        {
            if (fOriginalUTF8Code)
            {
                hr = ps.ParseUtf8Source(&parseTree, pszSrc, cbLength, grfscr, pse, &sourceContextInfo->nextLocalFunctionId,
                    sourceContextInfo);
                cchLength = ps.GetSourceIchLim();

                // Correcting total number of characters.
                utf8SourceInfo->SetCchLength(cchLength);
            }
            else
            {
                hr = ps.ParseCesu8Source(&parseTree, pszSrc, cbLength, grfscr, pse, &sourceContextInfo->nextLocalFunctionId,
                    sourceContextInfo);
            }

            utf8SourceInfo->SetParseFlags(grfscr);
            srcLength = ps.GetSourceLength();

            if (SUCCEEDED(hr))
            {
                sourceIndex = this->SaveSourceNoCopy(utf8SourceInfo, cchLength, isCesu8);
                hr = GenerateByteCode(parseTree, grfscr, this, func, sourceIndex, this->IsForceNoNative(), &ps, pse);
                utf8SourceInfo->SetByteCodeGenerationFlags(grfscr);
            }
        }

        if (SUCCEEDED(hr))
        {
            // If we are supposed to create a parser state cache, do that now since we have the generated code and the parser available.
            // Note: We do need to serialze the parser state cache again even if we just deserialized it because the data cache will
            // persist whatever we write into it and it starts empty.
            if (fUseParserStateCache)
            {
                Assert(*func != nullptr);
                TrySerializeParserState(computedSourceCRC, pszSrc, cbLength, srcInfo, *func, parserStateCacheBuffer, parserStateCacheByteCount, pDataCache);
            }
        }
#ifdef ENABLE_SCRIPT_DEBUGGING
        else if (this->IsScriptContextInDebugMode() && !utf8SourceInfo->GetIsLibraryCode() && !utf8SourceInfo->IsInDebugMode())
        {
            // In case of syntax error, if we are in debug mode, put the utf8SourceInfo into debug mode.
            utf8SourceInfo->SetInDebugMode(true);
        }
#endif

        return hr;
    }